

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phong.cpp
# Opt level: O1

RGBColor __thiscall pm::Phong::shade(Phong *this,ShadeRecord *sr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long *plVar4;
  bool bVar5;
  char cVar6;
  ulong uVar7;
  long in_RDX;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  RGBColor RVar15;
  Vector3 wi;
  Ray shadowRay;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  Phong *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_78 = ZEXT416(*(uint *)(in_RDX + 0x40));
  local_88 = ZEXT416(*(uint *)(in_RDX + 0x44));
  fVar13 = (sr->normal).z;
  fVar1 = (sr->ray).o.x;
  fVar10 = (sr->ray).o.y;
  fVar2 = (sr->ray).o.z;
  local_98 = ZEXT416(*(uint *)(in_RDX + 0x48));
  (**(code **)(**(long **)(*(long *)(in_RDX + 0x60) + 0x70) + 0x18))(&local_b8);
  fVar10 = fVar10 * fVar13 * local_b4;
  *(float *)&(this->super_Material)._vptr_Material = fVar1 * fVar13 * local_b8;
  *(float *)((long)&(this->super_Material)._vptr_Material + 4) = fVar10;
  (this->super_Material).type_ = (Type)(fVar13 * fVar2 * local_b0);
  local_d8 = *(float *)&(this->super_Material)._vptr_Material;
  local_dc = *(float *)((long)&(this->super_Material)._vptr_Material + 4);
  local_e0 = (float)(this->super_Material).type_;
  lVar9 = *(long *)(*(long *)(in_RDX + 0x60) + 0x80) - *(long *)(*(long *)(in_RDX + 0x60) + 0x78);
  local_a0 = this;
  if (lVar9 != 0) {
    local_58 = -(float)local_78._0_4_;
    uStack_54 = local_78._4_4_ ^ 0x80000000;
    uStack_50 = local_78._8_4_ ^ 0x80000000;
    uStack_4c = local_78._12_4_ ^ 0x80000000;
    local_68 = -(float)local_88._0_4_;
    uStack_64 = local_88._4_4_ ^ 0x80000000;
    uStack_60 = local_88._8_4_ ^ 0x80000000;
    uStack_5c = local_88._12_4_ ^ 0x80000000;
    local_48 = -(float)local_98._0_4_;
    uStack_44 = local_98._4_4_ ^ 0x80000000;
    uStack_40 = local_98._8_4_ ^ 0x80000000;
    uStack_3c = local_98._12_4_ ^ 0x80000000;
    uVar7 = 0;
    uVar8 = 1;
    do {
      plVar4 = *(long **)(*(long *)(*(long *)(in_RDX + 0x60) + 0x78) + uVar7 * 8);
      (**(code **)(*plVar4 + 0x10))(&local_d4,plVar4);
      fVar13 = *(float *)(in_RDX + 0x30) * local_cc +
               *(float *)(in_RDX + 0x28) * local_d4 + *(float *)(in_RDX + 0x2c) * local_d0;
      fVar10 = local_d0;
      if (0.0 < fVar13) {
        local_bc = fVar13;
        if (*(char *)((long)plVar4 + 0xc) == '\x01') {
          local_b8 = *(float *)(in_RDX + 0x10);
          local_b4 = *(float *)(in_RDX + 0x14);
          local_b0 = *(float *)(in_RDX + 0x18);
          local_ac = local_d4;
          local_a8 = local_d0;
          local_a4 = local_cc;
          cVar6 = (**(code **)(*plVar4 + 0x20))(plVar4,&local_b8);
          if (cVar6 != '\0') goto LAB_0010faff;
        }
        fVar13 = *(float *)&sr->world;
        fVar1 = *(float *)((long)&sr->world + 4);
        fVar2 = *(float *)&sr->tracer;
        fVar3 = *(float *)((long)&sr->tracer + 4);
        fVar10 = *(float *)(in_RDX + 0x28);
        fVar11 = *(float *)(in_RDX + 0x2c);
        fVar12 = *(float *)(in_RDX + 0x30);
        fVar14 = fVar12 * local_48 + fVar10 * local_58 + fVar11 * local_68;
        fVar10 = ((fVar12 + fVar12) * fVar14 + (float)local_98._0_4_) * local_cc +
                 ((fVar10 + fVar10) * fVar14 + (float)local_78._0_4_) * local_d4 +
                 ((fVar11 + fVar11) * fVar14 + (float)local_88._0_4_) * local_d0;
        fVar11 = 0.0;
        fVar12 = 0.0;
        fVar14 = 0.0;
        if (0.0 < fVar10) {
          local_c8 = sr[1].localHitPoint.y;
          local_c0 = sr[1].localHitPoint.z * local_c8;
          local_c4 = sr[1].normal.x * local_c8;
          local_c8 = local_c8 * sr[1].normal.y;
          fVar11 = powf(fVar10,sr[1].normal.z);
          fVar14 = local_c0 * fVar11;
          fVar12 = local_c4 * fVar11;
          fVar11 = local_c8 * fVar11;
        }
        (**(code **)(*plVar4 + 0x18))(&local_b8,plVar4);
        fVar10 = (fVar1 * fVar13 * 0.31830987 + fVar14) * local_b8 * local_bc;
        local_d8 = local_d8 + fVar10;
        local_dc = local_dc + (fVar2 * fVar13 * 0.31830987 + fVar12) * local_b4 * local_bc;
        local_e0 = local_e0 + (fVar13 * fVar3 * 0.31830987 + fVar11) * local_b0 * local_bc;
      }
LAB_0010faff:
      bVar5 = uVar8 < (ulong)(lVar9 >> 3);
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar5);
  }
  *(float *)&(local_a0->super_Material)._vptr_Material = local_d8;
  *(float *)((long)&(local_a0->super_Material)._vptr_Material + 4) = local_dc;
  (local_a0->super_Material).type_ = (Type)local_e0;
  RVar15.g = 0.0;
  RVar15.r = local_e0;
  RVar15.b = fVar10;
  return RVar15;
}

Assistant:

RGBColor Phong::shade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += (diffuseBrdf_.f(sr, wo, wi) + specularBrdf_.f(sr, wo, wi)) * light.L(sr) * nDotWi;
		}
	}

	return L;
}